

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_inspect(REF_FACE ref_face)

{
  REF_INT *pRVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  REF_INT sort [4];
  REF_INT orig [4];
  
  printf("ref_face = %p\n",ref_face);
  printf(" n = %d\n",(ulong)(uint)ref_face->n);
  printf(" max = %d\n",(ulong)(uint)ref_face->max);
  lVar4 = 0xc;
  for (uVar5 = 0; uVar3 = (ulong)ref_face->n, (long)uVar5 < (long)uVar3; uVar5 = uVar5 + 1) {
    pRVar1 = ref_face->f2n;
    printf("face %4d : %4d %4d %4d %4d\n",uVar5 & 0xffffffff,
           (ulong)*(uint *)((long)pRVar1 + lVar4 + -0xc),(ulong)*(uint *)((long)pRVar1 + lVar4 + -8)
           ,(ulong)*(uint *)((long)pRVar1 + lVar4 + -4),(ulong)*(uint *)((long)pRVar1 + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  uVar5 = 0;
  while( true ) {
    if ((long)(int)uVar3 <= (long)uVar5) {
      return 0;
    }
    pRVar1 = ref_face->f2n;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      orig[lVar4] = pRVar1[(ulong)((uint)uVar5 & 0x3fffffff) * 4 + lVar4];
    }
    uVar2 = ref_sort_insertion_int(4,orig,sort);
    if (uVar2 != 0) break;
    printf("sort %4d : %4d %4d %4d %4d\n",uVar5 & 0xffffffff,(ulong)(uint)sort[0],
           (ulong)(uint)sort[1],(ulong)(uint)sort[2],(ulong)(uint)sort[3]);
    uVar5 = uVar5 + 1;
    uVar3 = (ulong)(uint)ref_face->n;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x62,
         "ref_face_inspect",(ulong)uVar2,"sort");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_face_inspect(REF_FACE ref_face) {
  REF_INT face, node, orig[4], sort[4];

  printf("ref_face = %p\n", (void *)ref_face);
  printf(" n = %d\n", ref_face_n(ref_face));
  printf(" max = %d\n", ref_face_max(ref_face));
  for (face = 0; face < ref_face_n(ref_face); face++)
    printf("face %4d : %4d %4d %4d %4d\n", face,
           ref_face_f2n(ref_face, 0, face), ref_face_f2n(ref_face, 1, face),
           ref_face_f2n(ref_face, 2, face), ref_face_f2n(ref_face, 3, face));
  for (face = 0; face < ref_face_n(ref_face); face++) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, face);
    RSS(ref_sort_insertion_int(4, orig, sort), "sort");
    printf("sort %4d : %4d %4d %4d %4d\n", face, sort[0], sort[1], sort[2],
           sort[3]);
  }
  return REF_SUCCESS;
}